

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O2

void __thiscall
RenX_ModSystemPlugin::RenX_OnAdminLogout
          (RenX_ModSystemPlugin *this,Server *server,PlayerInfo *player)

{
  bool bVar1;
  long lVar2;
  ModGroup *pMVar3;
  long lVar4;
  int iVar5;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view name;
  
  if ((this->groups).
      super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
      ._M_impl._M_node._M_size == 0) {
    iVar5 = 0;
  }
  else {
    iVar5 = *(int *)&(this->groups).
                     super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                     ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
  }
  __x._M_str = "administrator";
  __x._M_len = 0xd;
  __y._M_str = (player->adminType)._M_dataplus._M_p;
  __y._M_len = (player->adminType)._M_string_length;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    iVar5 = 2;
    lVar2 = 0x108;
    lVar4 = 0x100;
  }
  else {
    __x_00._M_str = "moderator";
    __x_00._M_len = 9;
    __y_00._M_str = (player->adminType)._M_dataplus._M_p;
    __y_00._M_len = (player->adminType)._M_string_length;
    bVar1 = std::operator==(__x_00,__y_00);
    if (!bVar1) goto LAB_001102ec;
    iVar5 = 1;
    lVar2 = 0xe8;
    lVar4 = 0xe0;
  }
  name._M_str = *(char **)(&this->super_Plugin + lVar4);
  name._M_len = *(size_t *)(&this->super_Plugin + lVar2);
  pMVar3 = getGroupByName(this,name,(ModGroup *)0x0);
  if (pMVar3 != (ModGroup *)0x0) {
    iVar5 = pMVar3->access;
  }
LAB_001102ec:
  if (player->access <= iVar5) {
    if ((this->groups).
        super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
        ._M_impl._M_node._M_size == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *(int *)&(this->groups).
                       super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
    }
    player->access = iVar5;
  }
  return;
}

Assistant:

void RenX_ModSystemPlugin::RenX_OnAdminLogout(RenX::Server &server, const RenX::PlayerInfo &player) {
	ModGroup *group = nullptr;
	int access = RenX_ModSystemPlugin::groups.size() == 0 ? 0 : RenX_ModSystemPlugin::groups.front().access;
	if (player.adminType == game_administrator_name)
	{
		access = 2;
		group = getGroupByName(m_administratorGroup);
	}
	else if (player.adminType == game_moderator_name)
	{
		access = 1;
		group = getGroupByName(m_moderatorGroup);
	}
	if (group != nullptr)
		access = group->access;

	if (player.access <= access)
	{
		if (RenX_ModSystemPlugin::groups.size() == 0)
			player.access = 0;
		else
			player.access = RenX_ModSystemPlugin::groups.front().access;
	}
}